

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

string * __thiscall kws::Parser::GetLastErrors_abi_cxx11_(Parser *this)

{
  bool bVar1;
  char *__s;
  reference pEVar2;
  string *in_RDI;
  char *val;
  size_t length;
  const_iterator it;
  string *output;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *in_stack_ffffffffffffff58;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *in_stack_ffffffffffffff60;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *this_00;
  __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
  local_30 [3];
  allocator local_12;
  undefined1 local_11;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"",&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::begin(in_stack_ffffffffffffff58)
  ;
  __gnu_cxx::
  __normal_iterator<kws::ErrorStruct_const*,std::vector<kws::ErrorStruct,std::allocator<kws::ErrorStruct>>>
  ::__normal_iterator<kws::ErrorStruct*>
            ((__normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
              *)in_stack_ffffffffffffff60,
             (__normal_iterator<kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
              *)in_stack_ffffffffffffff58);
  while( true ) {
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::end(in_stack_ffffffffffffff58)
    ;
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar1) break;
    std::__cxx11::string::operator+=((string *)in_RDI,"Error #");
    __s = (char *)operator_new__(10);
    pEVar2 = __gnu_cxx::
             __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
             ::operator*(local_30);
    snprintf(__s,10,"%ld",pEVar2->number);
    std::__cxx11::string::operator+=((string *)in_RDI,__s);
    if (__s != (char *)0x0) {
      operator_delete__(__s);
    }
    std::__cxx11::string::operator+=((string *)in_RDI," (");
    in_stack_ffffffffffffff58 =
         (vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)operator_new__(10);
    in_stack_ffffffffffffff60 = in_stack_ffffffffffffff58;
    this_00 = in_stack_ffffffffffffff58;
    pEVar2 = __gnu_cxx::
             __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
             ::operator*(local_30);
    snprintf((char *)in_stack_ffffffffffffff60,10,"%ld",pEVar2->line);
    std::__cxx11::string::operator+=((string *)in_RDI,(char *)in_stack_ffffffffffffff58);
    if (in_stack_ffffffffffffff58 !=
        (vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)0x0) {
      operator_delete__(in_stack_ffffffffffffff58);
    }
    std::__cxx11::string::operator+=((string *)in_RDI,") ");
    pEVar2 = __gnu_cxx::
             __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
             ::operator*(local_30);
    std::__cxx11::string::operator+=((string *)in_RDI,(string *)&pEVar2->description);
    std::__cxx11::string::operator+=((string *)in_RDI,"\n");
    __gnu_cxx::
    __normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
    ::operator++((__normal_iterator<const_kws::ErrorStruct_*,_std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>
                  *)this_00,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  }
  return in_RDI;
}

Assistant:

std::string Parser::GetLastErrors()
{
  std::string output = "";
  std::vector<Error>::const_iterator it = m_ErrorList.begin();
  while(it != m_ErrorList.end())
    {
    output += "Error #";
    constexpr size_t length = 10;
    char* val = new char[length];
    snprintf(val,length,"%ld",(*it).number);
    output += val;
    delete [] val;
    output += " (";
    val = new char[length];
    snprintf(val,length,"%ld",(*it).line);
    output += val;
    delete [] val;
    output += ") ";
    output += (*it).description;
    output += "\n";
    it++;
    }
  return output;
}